

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_23240a::fillPixels(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  int in_EDX;
  int in_ESI;
  Array2D<Imf_3_2::Rgba> *in_RDI;
  float fVar2;
  Rgba *p;
  int x;
  int y;
  float in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      pRVar1 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](in_RDI,(long)local_14);
      pRVar1 = pRVar1 + local_18;
      sin((double)local_18 * 0.1 + (double)local_14 * 0.1);
      Imath_3_2::half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
      sin((double)local_18 * 0.1 + (double)local_14 * 0.2);
      Imath_3_2::half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
      sin((double)local_18 * 0.1 + (double)local_14 * 0.3);
      Imath_3_2::half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
      in_stack_ffffffffffffffdc = Imath_3_2::half::operator_cast_to_float(&pRVar1->r);
      fVar2 = Imath_3_2::half::operator_cast_to_float(&pRVar1->r);
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + fVar2;
      Imath_3_2::half::operator_cast_to_float(&pRVar1->r);
      Imath_3_2::half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void
fillPixels (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = 0.5 + 0.5 * sin (0.1 * x + 0.1 * y);
            p.g = 0.5 + 0.5 * sin (0.1 * x + 0.2 * y);
            p.b = 0.5 + 0.5 * sin (0.1 * x + 0.3 * y);
            p.a = (p.r + p.b + p.g) / 3.0;
        }
    }
}